

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4m_video_source.h
# Opt level: O0

void __thiscall libaom_test::Y4mVideoSource::OpenSource(Y4mVideoSource *this)

{
  bool bVar1;
  FILE *pFVar2;
  AssertHelper *this_00;
  char *in_RDI;
  string *in_stack_00000010;
  Message *in_stack_00000018;
  Y4mVideoSource *in_stack_00000020;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  Message *in_stack_ffffffffffffffa0;
  _IO_FILE **in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  Type in_stack_ffffffffffffffcc;
  AssertHelper *in_stack_ffffffffffffffd0;
  AssertionResult local_18;
  
  CloseSource(in_stack_00000020);
  pFVar2 = OpenTestDataFile(in_stack_00000010);
  *(FILE **)(in_RDI + 0x28) = pFVar2;
  testing::internal::CmpHelperNE<_IO_FILE*,decltype(nullptr)>
            ((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI,
             in_stack_ffffffffffffffa8,(void **)in_stack_ffffffffffffffa0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffd0);
    testing::Message::operator<<(in_stack_ffffffffffffffa0,(char (*) [35])in_stack_ffffffffffffff98)
    ;
    this_00 = (AssertHelper *)
              testing::Message::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    testing::AssertionResult::failure_message((AssertionResult *)0x3c7d36);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc,in_RDI);
    testing::internal::AssertHelper::operator=((AssertHelper *)in_stack_00000020,in_stack_00000018);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x3c7d82);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c7de2);
  return;
}

Assistant:

virtual void OpenSource() {
    CloseSource();
    input_file_ = OpenTestDataFile(file_name_);
    ASSERT_NE(input_file_, nullptr)
        << "Input file open failed. Filename: " << file_name_;
  }